

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_ircode.c
# Opt level: O0

void ircode_free(ircode_t *code)

{
  uint32_t uVar1;
  inst_t *inst;
  uint32_t i;
  uint32_t count;
  ircode_t *code_local;
  
  uVar1 = ircode_count(code);
  for (inst._0_4_ = 0; (uint)inst < uVar1; inst._0_4_ = (uint)inst + 1) {
    free(code->list->p[(uint)inst]);
  }
  if (code->list->p != (inst_t **)0x0) {
    free(code->list->p);
  }
  if ((code->context).p != (_Bool **)0x0) {
    free((code->context).p);
  }
  if ((code->registers).p != (uint32_t *)0x0) {
    free((code->registers).p);
  }
  if ((code->label_true).p != (uint32_t *)0x0) {
    free((code->label_true).p);
  }
  if ((code->label_false).p != (uint32_t *)0x0) {
    free((code->label_false).p);
  }
  if ((code->label_check).p != (uint32_t *)0x0) {
    free((code->label_check).p);
  }
  free(code->list);
  free(code);
  return;
}

Assistant:

void ircode_free (ircode_t *code) {
    uint32_t count = ircode_count(code);
    for (uint32_t i=0; i<count; ++i) {
        inst_t *inst = marray_get(*code->list, i);
        mem_free(inst);
    }

    marray_destroy(*code->list);
    marray_destroy(code->context);
    marray_destroy(code->registers);
    marray_destroy(code->label_true);
    marray_destroy(code->label_false);
    marray_destroy(code->label_check);
    mem_free(code->list);
    mem_free(code);
}